

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent
          (PathTypeHandlerWithAttr *this,Type *type,TypeEquivalenceRecord *record,
          uint *failedPropertyIndex)

{
  bool bVar1;
  ObjectSlotAttributes **ppOVar2;
  uint *failedPropertyIndex_local;
  TypeEquivalenceRecord *record_local;
  Type *type_local;
  PathTypeHandlerWithAttr *this_local;
  
  ppOVar2 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                      ((WriteBarrierPtr *)&this->attributes);
  bVar1 = PathTypeHandlerBase::IsObjTypeSpecEquivalentHelper
                    ((PathTypeHandlerBase *)this,type,*ppOVar2,record,failedPropertyIndex);
  return bVar1;
}

Assistant:

bool PathTypeHandlerWithAttr::IsObjTypeSpecEquivalent(const Type* type, const TypeEquivalenceRecord& record, uint& failedPropertyIndex)
    {
        return IsObjTypeSpecEquivalentHelper(type, attributes, record, failedPropertyIndex);
    }